

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void CheckReadInt<short>(char code)

{
  bool bVar1;
  AssertHelper *this;
  undefined1 unaff_retaddr;
  string *in_stack_00000008;
  ReadError *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  Type_conflict1 max;
  AssertionResult gtest_ar_1;
  short min;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  char *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  Type in_stack_fffffffffffffc7c;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  CStringRef in_stack_fffffffffffffc88;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  short *in_stack_fffffffffffffc98;
  allocator<char> *args_1;
  char *in_stack_fffffffffffffca0;
  CStringRef arg0;
  Message *in_stack_fffffffffffffcc8;
  AssertHelper *in_stack_fffffffffffffcd0;
  BasicCStringRef<char> local_318;
  string local_310 [32];
  string local_2f0 [38];
  byte local_2ca;
  allocator<char> local_2c9;
  string local_2c8 [32];
  AssertionResult local_2a8 [2];
  BasicCStringRef<char> local_288;
  string local_280 [32];
  string local_260 [32];
  double local_240;
  BasicCStringRef<char> local_238;
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [32];
  string local_1e8 [32];
  AssertionResult local_1c8;
  ushort local_1b2;
  BasicCStringRef<char> local_1a0;
  string local_198 [32];
  string local_178 [32];
  double local_158;
  BasicCStringRef<char> local_150;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [32];
  string local_100 [32];
  AssertionResult local_e0;
  short local_ca;
  BasicCStringRef<char> local_b8;
  string local_b0 [32];
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [32];
  string local_38 [32];
  AssertionResult local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88.data_,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  std::operator+(in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_b8,"C0\n{}4.2\n");
  fmt::format<char>(in_stack_fffffffffffffc88,
                    (char *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  ReadNL(in_stack_00000008,(bool)unaff_retaddr);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
             in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    testing::AssertionResult::failure_message((AssertionResult *)0x189b97);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
               in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc50);
    testing::Message::~Message((Message *)0x189bf4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x189c65);
  local_ca = std::numeric_limits<short>::min();
  arg0.data_ = (char *)&local_121;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88.data_,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_150,"c0: {};");
  local_158 = (double)(int)local_ca + 0.0;
  fmt::format<double>(in_stack_fffffffffffffc88,
                      (double *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc88.data_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_1a0,"C0\n{}{}\n");
  fmt::format<char,short>(arg0,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  ReadNL(in_stack_00000008,(bool)unaff_retaddr);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
             in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    in_stack_fffffffffffffca0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x189f07);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
               in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc50);
    testing::Message::~Message((Message *)0x189f64);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x189fd5);
  local_1b2 = std::numeric_limits<short>::max();
  args_1 = &local_209;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88.data_,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_238,"c0: {};");
  local_240 = (double)local_1b2 + 0.0;
  fmt::format<double>(in_stack_fffffffffffffc88,
                      (double *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc88.data_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_288,"C0\n{}{}\n");
  fmt::format<char,unsigned_short>(arg0,in_stack_fffffffffffffca0,(unsigned_short *)args_1);
  ReadNL(in_stack_00000008,(bool)unaff_retaddr);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
             in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    in_stack_fffffffffffffc90 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x18a277);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
               in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc50);
    testing::Message::~Message((Message *)0x18a2d4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x18a345);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a8);
  if (bVar1) {
    __s = &local_2c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc90,(char *)__s,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    std::allocator<char>::~allocator(&local_2c9);
    local_2ca = 0;
    in_stack_fffffffffffffc87 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffc87) {
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_318,"C0\n{}{}\n");
      fmt::format<char,int>(arg0,in_stack_fffffffffffffca0,(int *)args_1);
      ReadNL(in_stack_00000008,(bool)unaff_retaddr);
      std::__cxx11::string::~string(local_2f0);
      std::__cxx11::string::~string(local_310);
    }
    bVar1 = (local_2ca & 1) != 0;
    if (!bVar1) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (char (*) [127])CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    }
    std::__cxx11::string::~string(local_2c8);
    if (bVar1) goto LAB_0018a7c6;
  }
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  this = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x18a717);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
             in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
             in_stack_fffffffffffffc60);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  testing::internal::AssertHelper::~AssertHelper(this);
  testing::Message::~Message((Message *)0x18a76b);
LAB_0018a7c6:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x18a7d3);
  return;
}

Assistant:

void CheckReadInt(char code) {
  EXPECT_READ("c0: 4;", fmt::format("C0\n{}4.2\n", code));
  Int min = std::numeric_limits<Int>::min();
  EXPECT_READ(fmt::format("c0: {};", min + 0.),
               fmt::format("C0\n{}{}\n", code, min));
  typename mp::MakeUnsigned<Int>::Type max = std::numeric_limits<Int>::max();
  EXPECT_READ(fmt::format("c0: {};", max + 0.),
               fmt::format("C0\n{}{}\n", code, max));
  EXPECT_READ_ERROR(fmt::format("C0\n{}{}\n", code, max + 1),
    "(input):18:2: number is too big");
}